

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
find<kj::HashMap<kj::StringPtr,unsigned_short>::Entry_const,capnp::Text::Reader&>
          (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table,Reader *params)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  Entry *pEVar7;
  ArrayPtr<const_char> *in_R8;
  uint uVar8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  
  pEVar7 = table.ptr;
  aVar6.value = table.size_;
  if (pEVar7[1].key.content.ptr != (char *)0x0) {
    uVar4 = hashCode<capnp::Text::Reader&>((Reader *)in_R8);
    pcVar5 = pEVar7[1].key.content.ptr;
    uVar8 = (int)pcVar5 - 1U & uVar4;
    aVar6 = extraout_RDX;
    while( true ) {
      uVar9 = (ulong)uVar8;
      lVar2 = *(long *)&pEVar7->value;
      iVar1 = *(int *)(lVar2 + 4 + uVar9 * 8);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)(lVar2 + uVar9 * 8) == uVar4)) {
        bVar3 = ArrayPtr<const_char>::operator==
                          ((ArrayPtr<const_char> *)((ulong)(iVar1 - 2) * 0x18 + table.size_),in_R8);
        aVar6 = extraout_RDX_00;
        if (bVar3) {
          iVar1 = *(int *)(lVar2 + 4 + uVar9 * 8);
          *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x1;
          *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
          goto LAB_00175700;
        }
        pcVar5 = pEVar7[1].key.content.ptr;
      }
      uVar8 = (uint)(char *)(uVar9 + 1);
      if ((char *)(uVar9 + 1) == pcVar5) {
        uVar8 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x0;
LAB_00175700:
  MVar10.ptr.field_1.value = aVar6.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }